

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ValueHolder *this_00;
  pointer pVVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  pthread_key_t *in_RDI;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  GTestLog in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  TestPartResultReporterInterface **local_8;
  
  pvVar3 = pthread_getspecific(*in_RDI);
  if (pvVar3 == (void *)0x0) {
    pVVar4 = std::
             unique_ptr<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
             ::operator->((unique_ptr<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
                           *)0x1525d1);
    iVar1 = (*pVVar4->_vptr_ValueHolderFactory[2])();
    iVar2 = pthread_setspecific(*in_RDI,(ValueHolder *)CONCAT44(extraout_var,iVar1));
    if (iVar2 != 0) {
      GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
      poVar5 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffd0);
      poVar5 = std::operator<<(poVar5,"pthread_setspecific(key_, holder_base)");
      poVar5 = std::operator<<(poVar5,"failed with error ");
      std::ostream::operator<<(poVar5,iVar2);
      GTestLog::~GTestLog((GTestLog *)poVar5);
    }
    local_8 = ValueHolder::pointer((ValueHolder *)CONCAT44(extraout_var,iVar1));
  }
  else {
    this_00 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                        ((ThreadLocalValueHolderBase *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.severity_));
    local_8 = ValueHolder::pointer(this_00);
  }
  return local_8;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != nullptr) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = default_factory_->MakeNewHolder();
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }